

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PrivkeyData::ConvertFromStruct(PrivkeyData *this,PrivkeyDataStruct *data)

{
  PrivkeyDataStruct *data_local;
  PrivkeyData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->privkey_,(string *)data);
  this->wif_ = (bool)(data->wif & 1);
  std::__cxx11::string::operator=((string *)&this->network_,(string *)&data->network);
  this->is_compressed_ = (bool)(data->is_compressed & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PrivkeyData::ConvertFromStruct(
    const PrivkeyDataStruct& data) {
  privkey_ = data.privkey;
  wif_ = data.wif;
  network_ = data.network;
  is_compressed_ = data.is_compressed;
  ignore_items = data.ignore_items;
}